

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrixCursor.h
# Opt level: O0

this_t * __thiscall
ZXing::BitMatrixCursor<ZXing::PointT<double>_>::turnedBack
          (BitMatrixCursor<ZXing::PointT<double>_> *this)

{
  PointT<double> p;
  undefined8 *in_RSI;
  this_t *in_RDI;
  PointT<double> d;
  this_t *image;
  BitMatrixCursor<ZXing::PointT<double>_> *this_00;
  double dVar1;
  double dVar2;
  
  this_00 = (BitMatrixCursor<ZXing::PointT<double>_> *)*in_RSI;
  dVar1 = (double)in_RSI[1];
  dVar2 = (double)in_RSI[2];
  image = in_RDI;
  d = back((BitMatrixCursor<ZXing::PointT<double>_> *)0x2f7f3e);
  p.y = dVar2;
  p.x = dVar1;
  BitMatrixCursor(this_00,(BitMatrix *)image,p,d);
  return in_RDI;
}

Assistant:

this_t turnedBack() const noexcept { return {*img, p, back()}; }